

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_dec_utils.c
# Opt level: O0

void InitCorrectionLUT(int16_t *lut,int min_dist)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int local_2c;
  int local_28;
  int c;
  int i;
  int delta;
  int max_threshold;
  int threshold2;
  int threshold1;
  int min_dist_local;
  int16_t *lut_local;
  
  iVar2 = min_dist * 4;
  iVar3 = min_dist * 0xc >> 2;
  for (i = 1; i < 0x400; i = i + 1) {
    if (iVar3 < i) {
      if (i < iVar2) {
        local_2c = (iVar3 * (iVar2 - i)) / (iVar2 - iVar3);
      }
      else {
        local_2c = 0;
      }
      local_28 = local_2c;
    }
    else {
      local_28 = i;
    }
    sVar1 = (short)(local_28 >> 2);
    lut[i] = sVar1;
    lut[-i] = -sVar1;
  }
  *lut = 0;
  return;
}

Assistant:

static void InitCorrectionLUT(int16_t* const lut, int min_dist) {
  // The correction curve is:
  //   f(x) = x for x <= threshold2
  //   f(x) = 0 for x >= threshold1
  // and a linear interpolation for range x=[threshold2, threshold1]
  // (along with f(-x) = -f(x) symmetry).
  // Note that: threshold2 = 3/4 * threshold1
  const int threshold1 = min_dist << LFIX;
  const int threshold2 = (3 * threshold1) >> 2;
  const int max_threshold = threshold2 << DFIX;
  const int delta = threshold1 - threshold2;
  int i;
  for (i = 1; i <= LUT_SIZE; ++i) {
    int c = (i <= threshold2) ? (i << DFIX)
          : (i < threshold1) ? max_threshold * (threshold1 - i) / delta
          : 0;
    c >>= LFIX;
    lut[+i] = +c;
    lut[-i] = -c;
  }
  lut[0] = 0;
}